

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_absl::lts_20250127::flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,absl::lts_20250127::flat_hash_set<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,absl::lts_20250127::flat_hash_set<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>>>>
::find_or_prepare_insert_non_soo<google::protobuf::FileDescriptor_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_absl::lts_20250127::flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,absl::lts_20250127::flat_hash_set<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,absl::lts_20250127::flat_hash_set<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>>>>
          *this,FileDescriptor **key)

{
  char *pcVar1;
  PolicyFunctions *pPVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  undefined1 uVar7;
  bool bVar8;
  size_t sVar9;
  uint uVar10;
  ctrl_t *pcVar11;
  ushort uVar12;
  PolicyFunctions *policy;
  bool bVar13;
  ulong uVar14;
  CommonFields *common;
  anon_union_8_1_a8a14541_for_iterator_2 aVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  __m128i match;
  FindInfo target;
  ulong local_68;
  char cVar19;
  char cVar21;
  char cVar22;
  char cVar23;
  
  pPVar2 = *(PolicyFunctions **)(this + 0x10);
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar14 = ((ulong)*key ^ 0x1976508) * -0x234dd359734ecb13;
  uVar14 = ((uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
             (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
             (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 |
            uVar14 << 0x38) ^ (ulong)*key) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 | (uVar14 & 0xff0000000000) >> 0x18
            | (uVar14 & 0xff00000000) >> 8 | (uVar14 & 0xff000000) << 8 |
            (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38);
  uVar16 = ((ulong)common >> 7 ^ (ulong)pPVar2 >> 0xc) & uVar3;
  uVar7 = (undefined1)(uVar14 >> 0x38);
  auVar17 = ZEXT216(CONCAT11(uVar7,uVar7) & 0x7f7f);
  auVar17 = pshuflw(auVar17,auVar17,0);
  pcVar11 = (__return_storage_ptr__->first).ctrl_;
  aVar15 = (__return_storage_ptr__->first).field_1;
  bVar13 = __return_storage_ptr__->second;
  local_68 = 0;
  do {
    pcVar1 = (char *)((long)&pPVar2->slot_size + uVar16);
    cVar19 = auVar17[0];
    auVar20[0] = -(cVar19 == *pcVar1);
    cVar21 = auVar17[1];
    auVar20[1] = -(cVar21 == pcVar1[1]);
    cVar22 = auVar17[2];
    auVar20[2] = -(cVar22 == pcVar1[2]);
    cVar23 = auVar17[3];
    auVar20[3] = -(cVar23 == pcVar1[3]);
    auVar20[4] = -(cVar19 == pcVar1[4]);
    auVar20[5] = -(cVar21 == pcVar1[5]);
    auVar20[6] = -(cVar22 == pcVar1[6]);
    auVar20[7] = -(cVar23 == pcVar1[7]);
    auVar20[8] = -(cVar19 == pcVar1[8]);
    auVar20[9] = -(cVar21 == pcVar1[9]);
    auVar20[10] = -(cVar22 == pcVar1[10]);
    auVar20[0xb] = -(cVar23 == pcVar1[0xb]);
    auVar20[0xc] = -(cVar19 == pcVar1[0xc]);
    auVar20[0xd] = -(cVar21 == pcVar1[0xd]);
    auVar20[0xe] = -(cVar22 == pcVar1[0xe]);
    auVar20[0xf] = -(cVar23 == pcVar1[0xf]);
    uVar12 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf;
    uVar10 = (uint)uVar12;
    if (uVar12 != 0) {
      lVar4 = *(long *)(this + 0x18);
      do {
        uVar5 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar14 = uVar5 + uVar16 & uVar3;
        if (*(FileDescriptor **)(lVar4 + uVar14 * 0x28) == *key) {
          (__return_storage_ptr__->first).field_1 = aVar15;
          __return_storage_ptr__->second = bVar13;
          (__return_storage_ptr__->first).ctrl_ = pcVar11;
          if (*(long *)(this + 0x10) != 0) {
            (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar14);
            (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar4 + uVar14 * 0x28);
            __return_storage_ptr__->second = false;
            return __return_storage_ptr__;
          }
          goto LAB_00e41de2;
        }
        uVar12 = (ushort)(uVar10 - 1) & (ushort)uVar10;
        uVar10 = CONCAT22((short)(uVar10 - 1 >> 0x10),uVar12);
      } while (uVar12 != 0);
    }
    auVar18[0] = -(*pcVar1 == -0x80);
    auVar18[1] = -(pcVar1[1] == -0x80);
    auVar18[2] = -(pcVar1[2] == -0x80);
    auVar18[3] = -(pcVar1[3] == -0x80);
    auVar18[4] = -(pcVar1[4] == -0x80);
    auVar18[5] = -(pcVar1[5] == -0x80);
    auVar18[6] = -(pcVar1[6] == -0x80);
    auVar18[7] = -(pcVar1[7] == -0x80);
    auVar18[8] = -(pcVar1[8] == -0x80);
    auVar18[9] = -(pcVar1[9] == -0x80);
    auVar18[10] = -(pcVar1[10] == -0x80);
    auVar18[0xb] = -(pcVar1[0xb] == -0x80);
    auVar18[0xc] = -(pcVar1[0xc] == -0x80);
    auVar18[0xd] = -(pcVar1[0xd] == -0x80);
    auVar18[0xe] = -(pcVar1[0xe] == -0x80);
    auVar18[0xf] = -(pcVar1[0xf] == -0x80);
    uVar12 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf;
    if (uVar12 == 0) {
      if (*(ulong *)this < local_68 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar15;
        __return_storage_ptr__->second = bVar13;
        (__return_storage_ptr__->first).ctrl_ = pcVar11;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>>, K = const google::protobuf::FileDescriptor *]"
                     );
      }
      uVar16 = uVar16 + local_68 + 0x10 & uVar3;
      local_68 = local_68 + 0x10;
    }
    else {
      policy = pPVar2;
      bVar8 = ShouldInsertBackwardsForDebug
                        (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar8) {
        uVar6 = 0xf;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar10 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar10 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_68;
      sVar9 = PrepareInsertNonSoo((container_internal *)this,common,uVar10 + uVar16 & uVar3,target,
                                  policy);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar15;
        __return_storage_ptr__->second = bVar13;
        (__return_storage_ptr__->first).ctrl_ = pcVar11;
LAB_00e41de2:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, absl::flat_hash_set<const google::protobuf::FileDescriptor *>>>]"
                     );
      }
      pcVar11 = (ctrl_t *)(*(long *)(this + 0x10) + sVar9);
      aVar15.slot_ = (slot_type *)(sVar9 * 0x28 + *(long *)(this + 0x18));
      bVar13 = true;
    }
    if (uVar12 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar15;
      __return_storage_ptr__->second = bVar13;
      (__return_storage_ptr__->first).ctrl_ = pcVar11;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

ctrl_t* control() const {
    ABSL_SWISSTABLE_IGNORE_UNINITIALIZED_RETURN(heap.control);
  }